

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AppendTargetOutputs
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          cmNinjaTargetDepends depends)

{
  TargetType TVar1;
  cmMakefile *this_00;
  char *pcVar2;
  cmLocalGenerator *this_01;
  string *__rhs;
  string local_188;
  allocator local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string path;
  string local_e0;
  string local_c0;
  string local_a0;
  byte local_7e;
  allocator local_7d [7];
  bool realname;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string configName;
  cmNinjaTargetDepends depends_local;
  cmNinjaDeps *outputs_local;
  cmGeneratorTarget *target_local;
  cmGlobalNinjaGenerator *this_local;
  
  configName.field_2._12_4_ = depends;
  this_00 = cmTarget::GetMakefile(target->Target);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CMAKE_BUILD_TYPE",&local_69);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,pcVar2,local_7d);
  std::allocator<char>::~allocator((allocator<char> *)local_7d);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_7e = cmGeneratorTarget::IsFrameworkOnApple(target);
  TVar1 = cmGeneratorTarget::GetType(target);
  switch(TVar1) {
  case STATIC_LIBRARY:
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
    if (configName.field_2._12_4_ == 1) {
      OrderDependsTargetForTarget_abi_cxx11_(&local_a0,target);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(outputs,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      break;
    }
  case EXECUTABLE:
    cmGeneratorTarget::GetFullPath
              (&local_e0,target,(string *)local_48,RuntimeBinaryArtifact,(bool)(local_7e & 1));
    ConvertToNinjaPath(&local_c0,this,&local_e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(outputs,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    break;
  case OBJECT_LIBRARY:
    if (configName.field_2._12_4_ == 1) {
      OrderDependsTargetForTarget_abi_cxx11_((string *)((long)&path.field_2 + 8),target);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(outputs,(value_type *)((long)&path.field_2 + 8));
      std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
      break;
    }
  case UTILITY:
  case GLOBAL_TARGET:
    this_01 = cmGeneratorTarget::GetLocalGenerator(target);
    pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory(this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"/",&local_161);
    std::operator+(&local_140,pcVar2,&local_160);
    __rhs = cmGeneratorTarget::GetName_abi_cxx11_(target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   &local_140,__rhs);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    ConvertToNinjaPath(&local_188,this,(string *)local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(outputs,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)local_120);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetOutputs(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  cmNinjaTargetDepends depends)
{
  std::string configName =
    target->Target->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // for frameworks, we want the real name, not smple name
  // frameworks always appear versioned, and the build.ninja
  // will always attempt to manage symbolic links instead
  // of letting cmOSXBundleGenerator do it.
  bool realname = target->IsFrameworkOnApple();

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(OrderDependsTargetForTarget(target));
        break;
      }
    }
    // FALLTHROUGH
    case cmStateEnums::EXECUTABLE: {
      outputs.push_back(this->ConvertToNinjaPath(target->GetFullPath(
        configName, cmStateEnums::RuntimeBinaryArtifact, realname)));
      break;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(OrderDependsTargetForTarget(target));
        break;
      }
    }
    // FALLTHROUGH
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UTILITY: {
      std::string path =
        target->GetLocalGenerator()->GetCurrentBinaryDirectory() +
        std::string("/") + target->GetName();
      outputs.push_back(this->ConvertToNinjaPath(path));
      break;
    }

    default:
      return;
  }
}